

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

int nn_bws_listen(nn_bws *self)

{
  nn_usock *self_00;
  size_t sVar1;
  char *pcVar2;
  nn_usock *self_01;
  long in_RDI;
  uint16_t port;
  char *pos;
  char *end;
  char *addr;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  int rc;
  int in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  int domain;
  uint16_t __hostshort;
  sockaddr_storage *result;
  nn_usock *__s;
  sockaddr *addr_00;
  nn_usock *in_stack_ffffffffffffff58;
  short local_98;
  uint16_t local_96;
  int local_14;
  int local_4;
  
  self_00 = (nn_usock *)nn_ep_getaddr(*(nn_ep **)(in_RDI + 0x60));
  memset(&local_98,0,0x80);
  __s = self_00;
  sVar1 = strlen((char *)self_00);
  result = (sockaddr_storage *)((long)&(self_00->fsm).fn + sVar1);
  pcVar2 = strrchr((char *)__s,0x3a);
  if (pcVar2 == (char *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pos",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0x146);
    fflush(_stderr);
    nn_err_abort();
  }
  self_01 = (nn_usock *)(pcVar2 + 1);
  local_14 = nn_port_resolve((char *)self_01,(long)result - (long)self_01);
  local_4 = local_14;
  if (-1 < local_14) {
    domain = CONCAT22((short)local_14,in_stack_ffffffffffffff34);
    addr_00 = (sockaddr *)0x4;
    nn_ep_getopt((nn_ep *)0x4,(int)((ulong)__s >> 0x20),(int)__s,result,(size_t *)self_01);
    if (addr_00 != (sockaddr *)0x4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0x152);
      fflush(_stderr);
      nn_err_abort();
    }
    local_14 = nn_iface_resolve((char *)in_stack_ffffffffffffff58,4,(int)((ulong)__s >> 0x20),result
                                ,(size_t *)self_01);
    local_4 = local_14;
    if (-1 < local_14) {
      __hostshort = (uint16_t)((uint)domain >> 0x10);
      if (local_98 == 2) {
        local_96 = htons(__hostshort);
      }
      else {
        if (local_98 != 10) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
                  ,0x162);
          fflush(_stderr);
          nn_err_abort();
        }
        local_96 = htons(__hostshort);
      }
      local_14 = nn_usock_start(self_01,domain,in_stack_ffffffffffffff30,
                                (int)((ulong)self_00 >> 0x20));
      local_4 = local_14;
      if (-1 < local_14) {
        local_14 = nn_usock_bind(in_stack_ffffffffffffff58,addr_00,(size_t)__s);
        if (local_14 < 0) {
          nn_usock_stop((nn_usock *)0x144676);
          local_4 = local_14;
        }
        else {
          local_14 = nn_usock_listen(self_00,0);
          if (local_14 < 0) {
            nn_usock_stop((nn_usock *)0x1446be);
            local_4 = local_14;
          }
          else {
            nn_bws_start_accepting((nn_bws *)0x1446db);
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int nn_bws_listen (struct nn_bws *self)
{
    int rc;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    const char *addr;
    const char *end;
    const char *pos;
    uint16_t port;

    /*  First, resolve the IP address. */
    addr = nn_ep_getaddr (self->ep);
    memset (&ss, 0, sizeof (ss));

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    nn_assert (pos);
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (rc < 0) {
        return rc;
    }
    port = (uint16_t) rc;

    /*  Parse the address. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (rc < 0) {
        return rc;
    }

    /*  Combine the port and the address. */
    if (ss.ss_family == AF_INET) {
        ((struct sockaddr_in*) &ss)->sin_port = htons (port);
        sslen = sizeof (struct sockaddr_in);
    }
    else if (ss.ss_family == AF_INET6) {
        ((struct sockaddr_in6*) &ss)->sin6_port = htons (port);
        sslen = sizeof (struct sockaddr_in6);
    }
    else
        nn_assert (0);

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, ss.ss_family, SOCK_STREAM, 0);
    if (rc < 0) {
        return rc;
    }

    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &ss, (size_t) sslen);
    if (rc < 0) {
        nn_usock_stop (&self->usock);
        return rc;
    }

    rc = nn_usock_listen (&self->usock, NN_BWS_BACKLOG);
    if (rc < 0) {
        nn_usock_stop (&self->usock);
        return rc;
    }
    nn_bws_start_accepting(self);

    return 0;
}